

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-form.c
# Opt level: O2

size_t vstrnfmt(char *buf,size_t max,char *fmt,__va_list_tag *vp)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  undefined8 *puVar4;
  ushort **ppuVar5;
  uint *puVar6;
  size_t sVar7;
  long *plVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  size_t sVar13;
  byte bVar14;
  char *pcVar15;
  int *s;
  undefined8 local_8c0;
  char aux [128];
  char tmp [1024];
  char arg2 [1024];
  
  if (max == 0) {
    __assert_fail("max",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-form.c"
                  ,0xcd,"size_t vstrnfmt(char *, size_t, const char *, struct __va_list_tag *)");
  }
  if (fmt == (char *)0x0) {
    __assert_fail("fmt",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-form.c"
                  ,0xce,"size_t vstrnfmt(char *, size_t, const char *, struct __va_list_tag *)");
  }
  sVar11 = max - 1;
  local_8c0 = 0;
  sVar13 = 0;
LAB_002011bf:
  do {
    for (fmt = (char *)((byte *)fmt + 1); bVar14 = ((byte *)fmt)[-1], bVar14 == 0x25;
        fmt = (char *)((byte *)fmt + 2)) {
      bVar14 = *fmt;
      if (bVar14 != 0x6e) {
        if (bVar14 != 0x25) {
          aux[0] = '%';
          bVar1 = false;
          uVar12 = 1;
          goto LAB_0020124d;
        }
        sVar7 = sVar11;
        if (sVar13 == sVar11) goto LAB_00201626;
        buf[sVar13] = '%';
        sVar13 = sVar13 + 1;
        fmt = (char *)((byte *)fmt + 1);
        goto LAB_002011bf;
      }
      uVar3 = vp->gp_offset;
      if ((ulong)uVar3 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar3 + (long)vp->reg_save_area);
        vp->gp_offset = uVar3 + 8;
      }
      else {
        puVar4 = (undefined8 *)vp->overflow_arg_area;
        vp->overflow_arg_area = puVar4 + 1;
      }
      *(size_t *)*puVar4 = sVar13;
    }
    sVar7 = sVar13;
    if ((bVar14 == 0) || (sVar7 = sVar11, sVar13 == sVar11)) goto LAB_00201626;
    buf[sVar13] = bVar14;
    sVar13 = sVar13 + 1;
  } while( true );
LAB_0020124d:
  sVar7 = local_8c0;
  if ((bVar14 == 0) || (100 < uVar12)) goto LAB_00201626;
  ppuVar5 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar5 + (ulong)bVar14 * 2 + 1) & 4) == 0) {
    if (bVar14 != 0x2a) goto LAB_0020129c;
    uVar3 = vp->gp_offset;
    if ((ulong)uVar3 < 0x29) {
      puVar6 = (uint *)((ulong)uVar3 + (long)vp->reg_save_area);
      vp->gp_offset = uVar3 + 8;
    }
    else {
      puVar6 = (uint *)vp->overflow_arg_area;
      vp->overflow_arg_area = puVar6 + 2;
    }
    snprintf(aux + uVar12,0x80 - uVar12,"%d",(ulong)*puVar6);
    uVar12 = uVar12 - 1;
    do {
      lVar2 = uVar12 + 1;
      uVar12 = uVar12 + 1;
    } while (aux[lVar2] != '\0');
  }
  else {
    if (bVar14 != 0x6c) goto LAB_002012ed;
    bVar1 = true;
    bVar14 = 0x6c;
LAB_0020129c:
    aux[uVar12] = bVar14;
    uVar12 = uVar12 + 1;
  }
  bVar14 = ((byte *)fmt)[1];
  fmt = (char *)((byte *)fmt + 1);
  goto LAB_0020124d;
LAB_002012ed:
  aux[uVar12] = bVar14;
  aux[uVar12 + 1] = '\0';
  local_8c0 = 0;
  tmp[0] = '\0';
  switch(bVar14) {
  case 99:
    uVar3 = vp->gp_offset;
    if ((ulong)uVar3 < 0x29) {
      puVar6 = (uint *)((ulong)uVar3 + (long)vp->reg_save_area);
      vp->gp_offset = uVar3 + 8;
    }
    else {
      puVar6 = (uint *)vp->overflow_arg_area;
      vp->overflow_arg_area = puVar6 + 2;
    }
    snprintf(tmp,0x400,aux,(ulong)*puVar6);
    break;
  case 0x65:
  case 0x66:
  case 0x67:
switchD_0020131e_caseD_65:
    uVar3 = vp->fp_offset;
    if ((ulong)uVar3 < 0xa1) {
      puVar4 = (undefined8 *)((ulong)uVar3 + (long)vp->reg_save_area);
      vp->fp_offset = uVar3 + 0x10;
    }
    else {
      puVar4 = (undefined8 *)vp->overflow_arg_area;
      vp->overflow_arg_area = puVar4 + 1;
    }
    snprintf(tmp,0x400,aux,*puVar4);
    break;
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_0020131e_caseD_68:
    local_8c0 = 0;
    sVar7 = local_8c0;
LAB_00201626:
    local_8c0 = sVar7;
    buf[local_8c0] = '\0';
    return local_8c0;
  case 0x70:
    uVar3 = vp->gp_offset;
    if ((ulong)uVar3 < 0x29) {
      puVar4 = (undefined8 *)((ulong)uVar3 + (long)vp->reg_save_area);
      vp->gp_offset = uVar3 + 8;
    }
    else {
      puVar4 = (undefined8 *)vp->overflow_arg_area;
      vp->overflow_arg_area = puVar4 + 1;
    }
    snprintf(tmp,0x400,aux,*puVar4);
    break;
  case 0x73:
    if (bVar1) {
      uVar3 = vp->gp_offset;
      if ((ulong)uVar3 < 0x29) {
        plVar8 = (long *)((ulong)uVar3 + (long)vp->reg_save_area);
        vp->gp_offset = uVar3 + 8;
      }
      else {
        plVar8 = (long *)vp->overflow_arg_area;
        vp->overflow_arg_area = plVar8 + 1;
      }
      s = (int *)*plVar8;
      if (s == (wchar_t *)0x0) {
        s = anon_var_dwarf_1e4882;
      }
      sVar7 = text_wcslen(s);
      uVar3 = (uint)sVar7;
      if (0x2fe < (int)uVar3) {
        uVar3 = 0x2ff;
      }
      uVar9 = 0;
      if (0 < (int)uVar3) {
        uVar9 = (ulong)uVar3;
      }
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        arg2[uVar10] = (char)s[uVar10];
      }
      arg2[(int)uVar3] = '\0';
      pcVar15 = aux + (uVar12 - 1);
      pcVar15[0] = 's';
      pcVar15[1] = '\0';
      snprintf(tmp,0x400,aux,arg2);
      break;
    }
    uVar3 = vp->gp_offset;
    if ((ulong)uVar3 < 0x29) {
      plVar8 = (long *)((ulong)uVar3 + (long)vp->reg_save_area);
      vp->gp_offset = uVar3 + 8;
    }
    else {
      plVar8 = (long *)vp->overflow_arg_area;
      vp->overflow_arg_area = plVar8 + 1;
    }
    pcVar15 = (char *)*plVar8;
    if (pcVar15 == (char *)0x0) {
      pcVar15 = "";
    }
    my_strcpy(arg2,pcVar15,0x400);
    pcVar15 = arg2;
    goto LAB_002013f3;
  default:
    if ((bVar14 == 0x45) || (bVar14 == 0x47)) goto switchD_0020131e_caseD_65;
    if (bVar14 != 0x58) goto switchD_0020131e_caseD_68;
  case 100:
  case 0x69:
  case 0x6f:
  case 0x75:
  case 0x78:
    uVar3 = vp->gp_offset;
    if (bVar1) {
      if (uVar3 < 0x29) {
        plVar8 = (long *)((ulong)uVar3 + (long)vp->reg_save_area);
        vp->gp_offset = uVar3 + 8;
      }
      else {
        plVar8 = (long *)vp->overflow_arg_area;
        vp->overflow_arg_area = plVar8 + 1;
      }
      pcVar15 = (char *)*plVar8;
LAB_002013f3:
      snprintf(tmp,0x400,aux,pcVar15);
    }
    else {
      if (uVar3 < 0x29) {
        puVar6 = (uint *)((ulong)uVar3 + (long)vp->reg_save_area);
        vp->gp_offset = uVar3 + 8;
      }
      else {
        puVar6 = (uint *)vp->overflow_arg_area;
        vp->overflow_arg_area = puVar6 + 2;
      }
      snprintf(tmp,0x400,aux,(ulong)*puVar6);
    }
  }
  pcVar15 = tmp;
  fmt = (char *)((byte *)fmt + 1);
  for (; (*pcVar15 != '\0' && (sVar11 != sVar13)); sVar13 = sVar13 + 1) {
    buf[sVar13] = *pcVar15;
    pcVar15 = pcVar15 + 1;
  }
  goto LAB_002011bf;
}

Assistant:

size_t vstrnfmt(char *buf, size_t max, const char *fmt, va_list vp)
{
	const char *s;
	int i = 0, len = 0;

	/* The argument is "long" */
	bool do_long;

	/* Bytes used in buffer */
	size_t n;

	/* Bytes used in format sequence */
	size_t q;

	/* Format sequence */
	char aux[128];

	/* Resulting string */
	char tmp[1024];

	assert(max);
	assert(fmt);

	/* Begin the buffer */
	n = 0;

	/* Begin the format string */
	s = fmt;

	/* Scan the format string */
	while (true) {
		/* All done */
		if (!*s) break;

		/* Normal character */
		if (*s != '%') {
			/* Check total length */
			if (n == max-1) break;

			/* Save the character */
			buf[n++] = *s++;

			/* Continue */
			continue;
		}

		/* Skip the "percent" */
		s++;

		/* Pre-process "%%" */
		if (*s == '%') {
			/* Check total length */
			if (n == max-1) break;

			/* Save the percent */
			buf[n++] = '%';

			/* Skip the "%" */
			s++;

			/* Continue */
			continue;
		}

		/* Pre-process "%n" */
		if (*s == 'n') {
			size_t *arg;

			/* Get the next argument */
			arg = va_arg(vp, size_t *);

			/* Save the current length */
			(*arg) = n;

			/* Skip the "n" */
			s++;

			/* Continue */
			continue;
		}


		/* Begin the "aux" string */
		q = 0;

		/* Save the "percent" */
		aux[q++] = '%';

		do_long = false;

		/* Build the "aux" string */
		while (true) {
			/* Error -- format sequence is not terminated */
			if (!*s) {
				/* Terminate the buffer */
				buf[0] = '\0';

				/* Return "error" */
				return (0);
			}

			/* Error -- format sequence may be too long */
			if (q > 100) {
				/* Terminate the buffer */
				buf[0] = '\0';

				/* Return "error" */
				return (0);
			}

			/* Handle "alphabetic" or "non-alphabetic"chars */
			if (isalpha((unsigned char)*s)) {
				/* Hack -- handle "long" request */
				if (*s == 'l') {
					/* Save the character */
					aux[q++] = *s++;

					/* Note the "long" flag */
					do_long = true;
				} else {
					/* Save the character */
					aux[q++] = *s++;

					/* Stop processing the format sequence */
					break;
				}
			} else {
				/* Hack -- Handle 'star' (for "variable length" argument) */
				if (*s == '*') {
					int arg;

					/* Get the next argument */
					arg = va_arg(vp, int);

					/* Hack -- append the "length" */
					snprintf(aux + q, sizeof(aux) - q, "%d", arg);

					/* Hack -- accept the "length" */
					while (aux[q]) q++;

					/* Skip the "*" */
					s++;
				} else {
					/* Save the normal character (digits, "-", "+", ".", etc) */
					aux[q++] = *s++;
				}
			}
		}

		/* Terminate "aux" */
		aux[q] = '\0';

		/* Clear "tmp" */
		tmp[0] = '\0';

		/* Process the "format" symbol */
		switch (aux[q - 1]) {
			/* Simple Character -- standard format */
			case 'c':
			{
				int arg;

				/* Get the next argument */
				arg = va_arg(vp, int);

				/* Format the argument */
				snprintf(tmp, sizeof(tmp), aux, arg);

				/* Done */
				break;
			}

			/* Signed Integers -- standard format */
			case 'd': case 'i':
			{
				if (do_long) {
					long arg;

					/* Get the next argument */
					arg = va_arg(vp, long);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				} else {
					int arg;

					/* Get the next argument */
					arg = va_arg(vp, int);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				}

				/* Done */
				break;
			}

			/* Unsigned Integers -- various formats */
			case 'u': case 'o': case 'x': case 'X':
			{
				if (do_long) {
					unsigned long arg;

					/* Get the next argument */
					arg = va_arg(vp, unsigned long);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				} else {
					unsigned int arg;

					/* Get the next argument */
					arg = va_arg(vp, unsigned int);

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg);
				}

				/* Done */
				break;
			}

			/* Floating Point -- various formats */
			case 'f':
			case 'e': case 'E':
			case 'g': case 'G':
			{
				double arg;

				/* Get the next argument */
				arg = va_arg(vp, double);

				/* Format the argument */
				snprintf(tmp, sizeof(tmp), aux, arg);

				/* Done */
				break;
			}

			/* Pointer -- implementation varies */
			case 'p':
			{
				void *arg;

				/* Get the next argument */
				arg = va_arg(vp, void*);

				/* Format the argument */
				snprintf(tmp, sizeof(tmp), aux, arg);

				/* Done */
				break;
			}

			/* String */
			case 's':
			{
				if (do_long) {
					const wchar_t *arg;
					char arg2[1024];

					/* XXX There is a big bug here: if one
					 * passes "%.0s" to strnfmt, then really we
					 * should not dereference the arg at all.
					 * But it does.  See bug #666.
					 */

					/* Get the next argument */
					arg = va_arg(vp, const wchar_t *);

					/* Hack -- convert NULL to EMPTY */
					if (!arg) arg = L"";

					/* Prevent buffer overflows and convert string to char */
					/* this really should use a wcstombs type function */
					len = text_wcslen(arg);
					if (len >= 768) {
						len = 767;
					}
					for (i = 0; i < len; ++i) {
						arg2[i] = (char)arg[i];
					}
					arg2[len] = '\0';

					/* Remove the l from aux, since we no longer have wchar_t
					 * as input */
					aux[q-2] = 's';
					aux[q-1] = '\0';

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg2);

					/* Done */
					break;
				} else {
					const char *arg;
					char arg2[1024];

					/* XXX There is a big bug here: if one
					 * passes "%.0s" to strnfmt, then really we
					 * should not dereference the arg at all.
					 * But it does.  See bug #666.
					 */

					/* Get the next argument */
					arg = va_arg(vp, const char *);

					/* Hack -- convert NULL to EMPTY */
					if (!arg) arg = "";

					/* Prevent buffer overflows */
					(void)my_strcpy(arg2, arg, sizeof(arg2));

					/* Format the argument */
					snprintf(tmp, sizeof(tmp), aux, arg2);

					/* Done */
					break;
				}
			}

			/* Oops */
			default:
			{
				/* Error -- illegal format char */
				buf[0] = '\0';

				/* Return "error" */
				return (0);
			}
		}

		/* Now append "tmp" to "buf" */
		for (q = 0; tmp[q]; q++) {
			/* Check total length */
			if (n == max-1) break;

			/* Save the character */
			buf[n++] = tmp[q];
		}
	}


	/* Terminate buffer */
	buf[n] = '\0';

	/* Return length */
	return (n);
}